

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish.c
# Opt level: O0

rt_function_error_t exec_swish_generic(rt_function_t *f)

{
  undefined8 *puVar1;
  float fVar2;
  float y;
  float x;
  int i;
  swish_local_context_t *c;
  rt_function_t *f_local;
  
  puVar1 = (undefined8 *)f->local_context;
  for (y = 0.0; (int)y < *(int *)(puVar1 + 5); y = (float)((int)y + 1)) {
    fVar2 = (float)(*(code *)puVar1[1])(*puVar1,y);
    expf(-fVar2);
    (*(code *)puVar1[4])(puVar1[3],y);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_swish_generic(rt_function_t *f) {
  swish_local_context_t *c = (swish_local_context_t *)(f->local_context);

  int i; // Iterator
  for (i = 0; i < c->output_size; i++) {
    float x = c->get_input(c->input, i);
    float y = x * (1.0f / (1.0f + expf(-x)));
    c->set_output(c->output, i, y);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}